

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPLayer.cpp
# Opt level: O2

void __thiscall TCPLayer::notifyRead(TCPLayer *this)

{
  Buffer *pBVar1;
  int *piVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  PacketHandler *pPVar6;
  uint3 uVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  char c;
  _Vector_base<char,_std::allocator<char>_> local_440;
  char incomingData [1024];
  
  memset(incomingData,0,0x400);
  if (this->gotSize == false) {
    pBVar1 = &this->incomingPacket;
    iVar10 = Buffer::getSize(pBVar1);
    iVar10 = TCPSocket::receive(&this->socket,incomingData,4 - iVar10);
    Buffer::append(pBVar1,incomingData,(long)iVar10);
    iVar10 = Buffer::getSize(pBVar1);
    if (iVar10 == 4) {
      pcVar9 = Buffer::getData(pBVar1);
      cVar3 = *pcVar9;
      pcVar9 = Buffer::getData(pBVar1);
      cVar4 = pcVar9[1];
      pcVar9 = Buffer::getData(pBVar1);
      cVar5 = pcVar9[2];
      pcVar9 = Buffer::getData(pBVar1);
      uVar7 = CONCAT12(cVar5,CONCAT11(cVar4,cVar3));
      this->incomingPacketSize =
           (uint)(byte)pcVar9[3] | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
           CONCAT13(pcVar9[3],uVar7) << 0x18;
      Buffer::consume(pBVar1,4);
      this->gotSize = true;
    }
  }
  else {
    iVar10 = this->incomingPacketSize;
    pBVar1 = &this->incomingPacket;
    iVar8 = Buffer::getSize(pBVar1);
    iVar10 = iVar10 - iVar8;
    if (0x3ff < iVar10) {
      iVar10 = 0x400;
    }
    iVar10 = TCPSocket::receive(&this->socket,incomingData,iVar10);
    Buffer::append(pBVar1,incomingData,(long)iVar10);
    piVar2 = &this->incomingPacketSize;
    *piVar2 = *piVar2 - iVar10;
    if (*piVar2 == 0) {
      c = '\0';
      Buffer::append(pBVar1,&c,1);
      this->incomingPacketSize = 0;
      this->gotSize = false;
      pPVar6 = this->upperLayer;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_440,&pBVar1->data);
      (**pPVar6->_vptr_PacketHandler)(pPVar6,&local_440);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_440);
      iVar10 = Buffer::getSize(pBVar1);
      Buffer::consume(pBVar1,(long)iVar10);
    }
  }
  return;
}

Assistant:

void TCPLayer::notifyRead() {
    char incomingData[1024] = {0};


    if(!gotSize){
        int howManyBytesCanBeRead = sizeof(int) - incomingPacket.getSize();

        int readBytes = socket.receive(incomingData, howManyBytesCanBeRead);

        incomingPacket.append(incomingData, readBytes);

        if(incomingPacket.getSize() == sizeof(int)){
            char sizeBytes[sizeof(int)] = {0};
            sizeBytes[0] = incomingPacket.getData()[0];
            sizeBytes[1] = incomingPacket.getData()[1];
            sizeBytes[2] = incomingPacket.getData()[2];
            sizeBytes[3] = incomingPacket.getData()[3];

            int size = *(reinterpret_cast<int*>(sizeBytes));

            incomingPacketSize = ntohl(size);

            incomingPacket.consume(sizeof(int));
            gotSize = true;
        }
    }
    else{
        int howManyBytesCanBeRead = incomingPacketSize - incomingPacket.getSize();
        if(howManyBytesCanBeRead > 1024){
            howManyBytesCanBeRead = 1024;
        }

        int readBytes = socket.receive(incomingData, howManyBytesCanBeRead);

        incomingPacket.append(incomingData, readBytes);
        incomingPacketSize -= readBytes;

        if(incomingPacketSize == 0){
            char c = 0;
            incomingPacket.append(&c, 1);

            incomingPacketSize = 0;
            gotSize = false;

            upperLayer->handlePacket(incomingPacket);
            incomingPacket.consume(incomingPacket.getSize());
        }
    }

}